

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetectorTest.cpp
# Opt level: O2

void __thiscall
TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_Test::
TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_Test
          (TEST_MemoryLeakDetectorTest_freeOnlyTheMemoryInTheAllocationStage_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).reporter =
       (MemoryLeakFailureForTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).testAllocator =
       (AllocatorForMemoryLeakDetectionTest *)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).super_Utest._vptr_Utest =
       (_func_int **)0x0;
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).detector = (MemoryLeakDetector *)0x0;
  TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest::TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest
            (&this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest);
  (this->super_TEST_GROUP_CppUTestGroupMemoryLeakDetectorTest).super_Utest._vptr_Utest =
       (_func_int **)&PTR__Utest_0035ed80;
  return;
}

Assistant:

TEST(MemoryLeakDetectorTest, freeOnlyTheMemoryInTheAllocationStage)
{
    char* mem = detector->allocMemory(defaultMallocAllocator(), 2);
    detector->increaseAllocationStage();
    detector->allocMemory(defaultMallocAllocator(), 2);
    detector->deallocAllMemoryInCurrentAllocationStage();
    LONGS_EQUAL(1, detector->totalMemoryLeaks(mem_leak_period_all));
    detector->deallocMemory(defaultMallocAllocator(), mem);
}